

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_copy_unset_attributes
          (exr_context_t ctxt,int part_index,exr_const_context_t source,int src_part_index)

{
  exr_result_t eVar1;
  int in_ECX;
  exr_priv_part_t in_RDX;
  int in_ESI;
  exr_priv_part_t in_RDI;
  exr_attribute_t *attr;
  exr_attribute_t *srca;
  int a;
  exr_priv_part_t part;
  exr_priv_part_t in_stack_00000030;
  int update_tiles;
  exr_priv_part_t srcpart;
  exr_result_t rv;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 uVar2;
  int local_44;
  exr_attribute_t **out;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar3;
  exr_attribute_list_t *list;
  undefined4 in_stack_ffffffffffffffe8;
  exr_result_t local_4;
  
  iVar3 = 0;
  if (in_RDI == (exr_priv_part_t)0x0) {
    local_4 = 2;
  }
  else {
    internal_exr_lock((exr_const_context_t)
                      CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    if ((in_ESI < 0) || (in_RDI->num_tile_levels_y <= in_ESI)) {
      internal_exr_unlock((exr_const_context_t)
                          CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
      local_4 = (*(code *)in_RDI->pixelAspectRatio)(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      out = *(exr_attribute_t ***)(in_RDI[1].tile_level_tile_count_y + (long)in_ESI * 2);
      if (in_RDX == (exr_priv_part_t)0x0) {
        internal_exr_unlock((exr_const_context_t)
                            CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
        local_4 = 2;
      }
      else {
        if (in_RDX != in_RDI) {
          internal_exr_lock((exr_const_context_t)
                            CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
        }
        if ((in_ECX < 0) || (in_RDX->num_tile_levels_y <= in_ECX)) {
          if (in_RDX != in_RDI) {
            internal_exr_unlock((exr_const_context_t)
                                CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
          }
          internal_exr_unlock((exr_const_context_t)
                              CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
          local_4 = (*(code *)in_RDI->pixelAspectRatio)
                              (in_RDI,4,"Source part index (%d) out of range",in_ECX);
        }
        else {
          list = *(exr_attribute_list_t **)(in_RDX[1].tile_level_tile_count_y + (long)in_ECX * 2);
          local_4 = 0;
          local_44 = 0;
          while( true ) {
            uVar2 = false;
            if (local_4 == 0) {
              uVar2 = local_44 < *(int *)&list->entries;
            }
            if ((bool)uVar2 == false) break;
            eVar1 = exr_attr_list_find_by_name
                              ((exr_const_context_t)CONCAT44(in_ECX,local_4),list,
                               (char *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),out);
            if (eVar1 == 0xf) {
              local_4 = copy_attr((exr_context_t)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                                  (exr_attribute_t *)CONCAT44(in_ECX,0xf),&list->num_attributes);
            }
            else {
              local_4 = 0;
            }
            local_44 = local_44 + 1;
          }
          if (iVar3 != 0) {
            local_4 = internal_exr_compute_tile_information
                                ((exr_context_t)srcpart,in_stack_00000030,part._4_4_);
          }
          if (in_RDX != in_RDI) {
            internal_exr_unlock((exr_const_context_t)CONCAT17(uVar2,in_stack_ffffffffffffffa0));
          }
          internal_exr_unlock((exr_const_context_t)CONCAT17(uVar2,in_stack_ffffffffffffffa0));
        }
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_copy_unset_attributes (
    exr_context_t       ctxt,
    int                 part_index,
    exr_const_context_t source,
    int                 src_part_index)
{
    exr_result_t    rv;
    exr_priv_part_t srcpart;
    int             update_tiles = 0;
    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (!source) return EXR_UNLOCK_AND_RETURN (EXR_ERR_MISSING_CONTEXT_ARG);
    if (source != ctxt) internal_exr_lock (source);

    if (src_part_index < 0 || src_part_index >= source->num_parts)
    {
        if (source != ctxt) internal_exr_unlock (source);
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "Source part index (%d) out of range",
            src_part_index));
    }

    srcpart = source->parts[src_part_index];

    rv = EXR_ERR_SUCCESS;
    for (int a = 0;
         rv == EXR_ERR_SUCCESS && a < srcpart->attributes.num_attributes;
         ++a)
    {
        const exr_attribute_t* srca = srcpart->attributes.entries[a];
        exr_attribute_t*       attr = NULL;

        rv = exr_attr_list_find_by_name (
            ctxt,
            (exr_attribute_list_t*) &(part->attributes),
            srca->name,
            &attr);
        if (rv == EXR_ERR_NO_ATTR_BY_NAME)
        {
            rv = copy_attr (ctxt, part, srca, &update_tiles);
        }
        else { rv = EXR_ERR_SUCCESS; }
    }

    if (update_tiles)
        rv = internal_exr_compute_tile_information (ctxt, part, 1);

    if (source != ctxt) internal_exr_unlock (source);
    return EXR_UNLOCK_AND_RETURN (rv);
}